

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O0

bool testFromCharArray(String *str)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  size_type sVar4;
  String *substr_const;
  String substr;
  String *str_const;
  String *str_local;
  
  substr.view_._M_str = (char *)str;
  pcVar2 = cm::String::data(str);
  if (pcVar2 == "abc") {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(str_const.data() != charArray) failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x68);
    std::operator<<(poVar3,"\n");
    str_local._7_1_ = false;
  }
  else {
    sVar4 = cm::String::size((String *)substr.view_._M_str);
    if (sVar4 == 3) {
      bVar1 = cm::String::is_stable((String *)substr.view_._M_str);
      if (bVar1) {
        pcVar2 = cm::String::c_str(str);
        if (pcVar2 == "abc") {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(str.c_str() != charArray) failed on line ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6b);
          std::operator<<(poVar3,"\n");
          str_local._7_1_ = false;
        }
        else {
          bVar1 = cm::String::is_stable(str);
          if (bVar1) {
            cm::String::substr((String *)&substr_const,str,1,0xffffffffffffffff);
            pcVar2 = cm::String::data((String *)&substr_const);
            if (pcVar2 == "bc") {
              poVar3 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(substr_const.data() != &charArray[1]) failed on line "
                                      );
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6f);
              std::operator<<(poVar3,"\n");
              str_local._7_1_ = false;
            }
            else {
              sVar4 = cm::String::size((String *)&substr_const);
              if (sVar4 == 2) {
                bVar1 = cm::String::is_stable((String *)&substr_const);
                if (bVar1) {
                  poVar3 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(!substr_const.is_stable()) failed on line ")
                  ;
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x71);
                  std::operator<<(poVar3,"\n");
                  str_local._7_1_ = false;
                }
                else {
                  pcVar2 = cm::String::c_str((String *)&substr_const);
                  if (pcVar2 == "bc") {
                    poVar3 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(substr.c_str() != &charArray[1]) failed on line "
                                            );
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x72);
                    std::operator<<(poVar3,"\n");
                    str_local._7_1_ = false;
                  }
                  else {
                    bVar1 = cm::String::is_stable((String *)&substr_const);
                    if (bVar1) {
                      poVar3 = std::operator<<((ostream *)&std::cout,
                                               "ASSERT_TRUE(!substr.is_stable()) failed on line ");
                      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x73);
                      std::operator<<(poVar3,"\n");
                      str_local._7_1_ = false;
                    }
                    else {
                      str_local._7_1_ = true;
                    }
                  }
                }
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(substr_const.size() == 2) failed on line ");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x70);
                std::operator<<(poVar3,"\n");
                str_local._7_1_ = false;
              }
            }
            cm::String::~String((String *)&substr_const);
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(str.is_stable()) failed on line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6c);
            std::operator<<(poVar3,"\n");
            str_local._7_1_ = false;
          }
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(str_const.is_stable()) failed on line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6a);
        std::operator<<(poVar3,"\n");
        str_local._7_1_ = false;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(str_const.size() == sizeof(charArray) - 1) failed on line "
                              );
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x69);
      std::operator<<(poVar3,"\n");
      str_local._7_1_ = false;
    }
  }
  return str_local._7_1_;
}

Assistant:

static bool testFromCharArray(cm::String str)
{
  cm::String const& str_const = str;
  ASSERT_TRUE(str_const.data() != charArray);
  ASSERT_TRUE(str_const.size() == sizeof(charArray) - 1);
  ASSERT_TRUE(str_const.is_stable());
  ASSERT_TRUE(str.c_str() != charArray);
  ASSERT_TRUE(str.is_stable());
  cm::String substr = str.substr(1);
  cm::String const& substr_const = substr;
  ASSERT_TRUE(substr_const.data() != &charArray[1]);
  ASSERT_TRUE(substr_const.size() == 2);
  ASSERT_TRUE(!substr_const.is_stable());
  ASSERT_TRUE(substr.c_str() != &charArray[1]);
  ASSERT_TRUE(!substr.is_stable());
  return true;
}